

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transaction.cpp
# Opt level: O1

void __thiscall Transaction_GetRoInt_Test::TestBody(Transaction_GetRoInt_Test *this)

{
  TypedExpectation<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)>
  *this_00;
  mock_database *addr;
  mock_mutex mutex;
  transaction<std::unique_lock<mock_mutex>_> transaction;
  _Any_data local_128;
  code *local_118;
  MatcherBase<bool> local_108;
  MatcherBase<bool> local_f0;
  MatcherBase<unsigned_long> local_d8;
  MatcherBase<pstore::address> local_c0;
  MockSpec<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)> local_a8;
  undefined1 local_40 [24];
  code *local_28;
  __uniq_ptr_impl<pstore::system_page_size_interface,_std::default_delete<pstore::system_page_size_interface>_>
  local_20;
  
  testing::Matcher<pstore::address>::Matcher((Matcher<pstore::address> *)&local_c0,(address)0x0);
  testing::Matcher<unsigned_long>::Matcher((Matcher<unsigned_long> *)&local_d8,4);
  testing::Matcher<bool>::Matcher((Matcher<bool> *)&local_f0,true);
  testing::Matcher<bool>::Matcher((Matcher<bool> *)&local_108,false);
  addr = &(this->super_Transaction).db_;
  anon_unknown.dwarf_4168a5::mock_database::gmock_get
            (&local_a8,addr,(Matcher<pstore::address> *)&local_c0,
             (Matcher<unsigned_long> *)&local_d8,(Matcher<bool> *)&local_f0,
             (Matcher<bool> *)&local_108);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::
            MockSpec<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)>::
            InternalExpectedAt(&local_a8,
                               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
                               ,0x1c6,"db_",
                               "get (pstore::address::null (), sizeof (int), true, false)");
  local_28 = anon_unknown.dwarf_4168a5::mock_database::base_get;
  local_20._M_t.
  super__Tuple_impl<0UL,_pstore::system_page_size_interface_*,_std::default_delete<pstore::system_page_size_interface>_>
  .super__Head_base<0UL,_pstore::system_page_size_interface_*,_false>._M_head_impl =
       (tuple<pstore::system_page_size_interface_*,_std::default_delete<pstore::system_page_size_interface>_>
        )(_Tuple_impl<0UL,_pstore::system_page_size_interface_*,_std::default_delete<pstore::system_page_size_interface>_>
          )0x0;
  local_40._16_8_ = addr;
  testing::Action<std::shared_ptr<void_const>(pstore::address,unsigned_long,bool,bool)>::
  Action<testing::internal::InvokeMethodAction<(anonymous_namespace)::mock_database,std::shared_ptr<void_const>((anonymous_namespace)::mock_database::*)(pstore::address_const&,unsigned_long,bool,bool)const>,void>
            ((Action<std::shared_ptr<void_const>(pstore::address,unsigned_long,bool,bool)> *)
             local_128._M_pod_data,
             (InvokeMethodAction<(anonymous_namespace)::mock_database,_std::shared_ptr<const_void>_((anonymous_namespace)::mock_database::*)(const_pstore::address_&,_unsigned_long,_bool,_bool)_const>
              *)(local_40 + 0x10));
  testing::internal::
  TypedExpectation<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)>::
  WillOnce(this_00,(Action<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)>
                    *)&local_128);
  if (local_118 != (code *)0x0) {
    (*local_118)(&local_128,&local_128,__destroy_functor);
  }
  testing::internal::MatcherBase<pstore::address>::~MatcherBase
            ((MatcherBase<pstore::address> *)
             &local_a8.matchers_.
              super__Tuple_impl<0UL,_testing::Matcher<pstore::address>,_testing::Matcher<unsigned_long>,_testing::Matcher<bool>,_testing::Matcher<bool>_>
              .super__Head_base<0UL,_testing::Matcher<pstore::address>,_false>);
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase
            ((MatcherBase<unsigned_long> *)
             &local_a8.matchers_.
              super__Tuple_impl<0UL,_testing::Matcher<pstore::address>,_testing::Matcher<unsigned_long>,_testing::Matcher<bool>,_testing::Matcher<bool>_>
              .
              super__Tuple_impl<1UL,_testing::Matcher<unsigned_long>,_testing::Matcher<bool>,_testing::Matcher<bool>_>
              .super__Head_base<1UL,_testing::Matcher<unsigned_long>,_false>);
  testing::internal::MatcherBase<bool>::~MatcherBase
            ((MatcherBase<bool> *)
             &local_a8.matchers_.
              super__Tuple_impl<0UL,_testing::Matcher<pstore::address>,_testing::Matcher<unsigned_long>,_testing::Matcher<bool>,_testing::Matcher<bool>_>
              .
              super__Tuple_impl<1UL,_testing::Matcher<unsigned_long>,_testing::Matcher<bool>,_testing::Matcher<bool>_>
              .super__Tuple_impl<2UL,_testing::Matcher<bool>,_testing::Matcher<bool>_>.
              super__Head_base<2UL,_testing::Matcher<bool>,_false>);
  testing::internal::MatcherBase<bool>::~MatcherBase((MatcherBase<bool> *)&local_a8.matchers_);
  testing::internal::MatcherBase<bool>::~MatcherBase(&local_108);
  testing::internal::MatcherBase<bool>::~MatcherBase(&local_f0);
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase(&local_d8);
  testing::internal::MatcherBase<pstore::address>::~MatcherBase(&local_c0);
  local_128._M_pod_data[8] = '\0';
  local_128._M_unused._M_object = &local_c0;
  std::unique_lock<mock_mutex>::lock((unique_lock<mock_mutex> *)&local_128);
  local_128._M_pod_data[8] = '\x01';
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction
            ((transaction<std::unique_lock<mock_mutex>_> *)&local_a8,&addr->super_database,
             (lock_type *)&local_128);
  if ((local_128._M_pod_data[8] == '\x01') &&
     ((MatcherBase<pstore::address> *)local_128._M_unused._0_8_ !=
      (MatcherBase<pstore::address> *)0x0)) {
    local_128._M_pod_data[8] = '\0';
  }
  pstore::database::getro<int,void>((database *)local_40,(typed_address<int>)addr,0);
  if ((_Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>)local_40._8_8_ !=
      (_Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._8_8_);
  }
  pstore::transaction_base::commit((transaction_base *)&local_a8);
  local_a8.function_mocker_ =
       (FunctionMocker<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)> *)
       &PTR__transaction_00271290;
  pstore::transaction_base::rollback((transaction_base *)&local_a8);
  return;
}

Assistant:

TEST_F (Transaction, GetRoInt) {
    // First setup the mock expectations.
    EXPECT_CALL (db_, get (pstore::address::null (), sizeof (int), true, false))
        .WillOnce (::testing::Invoke (&db_, &mock_database::base_get));

    // Now the real body of the test
    {
        mock_mutex mutex;
        auto transaction = begin (db_, std::unique_lock<mock_mutex>{mutex});
        db_.getro (pstore::typed_address<int>::null (), 1);
        transaction.commit ();
    }
}